

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradeclient.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  SocketInitiator *this;
  pointer pIVar2;
  exception *e;
  unique_ptr<FIX::Initiator,std::default_delete<FIX::Initiator>> local_328 [8];
  unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_> local_320;
  unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_> initiator;
  LogFactory local_288;
  ScreenLogFactory logFactory;
  MessageStoreFactory local_1e8;
  FileStoreFactory storeFactory;
  undefined1 local_130 [8];
  Application application;
  SessionSettings settings;
  allocator<char> local_39;
  string local_38 [8];
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar1 = std::operator<<(poVar1,*(char **)file.field_2._8_8_);
    poVar1 = std::operator<<(poVar1," FILE.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    FIX::SessionSettings::SessionSettings
              ((SessionSettings *)&application.super_MessageCracker.super_MessageCracker,local_38,
               false);
    Application::Application((Application *)local_130);
    FIX::FileStoreFactory::FileStoreFactory
              ((FileStoreFactory *)&local_1e8,
               (SessionSettings *)&application.super_MessageCracker.super_MessageCracker);
    FIX::SessionSettings::SessionSettings
              ((SessionSettings *)&initiator,
               (SessionSettings *)&application.super_MessageCracker.super_MessageCracker);
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)&local_288,(SessionSettings *)&initiator);
    FIX::SessionSettings::~SessionSettings((SessionSettings *)&initiator);
    std::unique_ptr<FIX::Initiator,std::default_delete<FIX::Initiator>>::
    unique_ptr<std::default_delete<FIX::Initiator>,void>
              ((unique_ptr<FIX::Initiator,std::default_delete<FIX::Initiator>> *)&local_320);
    this = (SocketInitiator *)operator_new(0x488);
    FIX::SocketInitiator::SocketInitiator
              (this,(Application *)local_130,&local_1e8,
               (SessionSettings *)&application.super_MessageCracker.super_MessageCracker,&local_288)
    ;
    std::unique_ptr<FIX::Initiator,std::default_delete<FIX::Initiator>>::
    unique_ptr<std::default_delete<FIX::Initiator>,void>(local_328,(pointer)this);
    std::unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_>::operator=
              (&local_320,
               (unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_> *)local_328);
    std::unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_>::~unique_ptr
              ((unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_> *)local_328);
    std::unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_>::operator->(&local_320);
    FIX::Initiator::start();
    Application::run((Application *)local_130);
    pIVar2 = std::unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_>::operator->
                       (&local_320);
    FIX::Initiator::stop(SUB81(pIVar2,0));
    std::unique_ptr<FIX::Initiator,_std::default_delete<FIX::Initiator>_>::~unique_ptr(&local_320);
    FIX::ScreenLogFactory::~ScreenLogFactory((ScreenLogFactory *)&local_288);
    FIX::FileStoreFactory::~FileStoreFactory((FileStoreFactory *)&local_1e8);
    Application::~Application((Application *)local_130);
    FIX::SessionSettings::~SessionSettings
              ((SessionSettings *)&application.super_MessageCracker.super_MessageCracker);
    std::__cxx11::string::~string(local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Initiator> initiator;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::ThreadedSSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::SSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else
#endif
      initiator
          = std::unique_ptr<FIX::Initiator>(new FIX::SocketInitiator(application, storeFactory, settings, logFactory));

    initiator->start();
    application.run();
    initiator->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what();
    return 1;
  }
}